

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::GenerateDynamicInterpreterThunk(FunctionBody *this)

{
  Type *ppDynamicInterpreterThunk;
  ushort uVar1;
  PVOID dynamicInterpreterThunk;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  char *message;
  char *error;
  
  if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0) &&
     (uVar4 = GetByteCodeCount(this), uVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeeb,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                "The wasm function should have been parsed before generating the dynamic interpreter thunk"
                               );
    if (!bVar3) goto LAB_006ce075;
    *puVar5 = 0;
  }
  ppDynamicInterpreterThunk = &(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
  dynamicInterpreterThunk = (this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
  if (dynamicInterpreterThunk == (PVOID)0x0) {
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
      p_Var6 = ScriptContext::GetNextDynamicInterpreterThunk(this_00,ppDynamicInterpreterThunk);
    }
    else {
      p_Var6 = ScriptContext::GetNextDynamicAsmJsInterpreterThunk(this_00,ppDynamicInterpreterThunk)
      ;
    }
  }
  else {
    p_Var6 = (JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(dynamicInterpreterThunk)
    ;
  }
  FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,p_Var6);
  bVar3 = ThreadContext::NoDynamicThunks
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     threadContext);
  if (bVar3) {
    if (*ppDynamicInterpreterThunk != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf07,"(this->m_dynamicInterpreterThunk == nullptr)",
                                  "this->m_dynamicInterpreterThunk == nullptr");
      if (!bVar3) goto LAB_006ce075;
      *puVar5 = 0;
    }
    uVar1 = *(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    if ((uVar1 >> 10 & 1) == 0) {
      if (p_Var6 == InterpreterStackFrame::StaticInterpreterThunk) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      error = 
      "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk)"
      ;
      message = 
      "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk"
      ;
      uVar4 = 0xf0f;
    }
    else {
      if (p_Var6 == InterpreterStackFrame::StaticInterpreterAsmThunk) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      error = 
      "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk)"
      ;
      message = 
      "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk"
      ;
      uVar4 = 0xf0b;
    }
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,uVar4,error,message);
    if (!bVar3) {
LAB_006ce075:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void FunctionBody::GenerateDynamicInterpreterThunk()
    {
        AssertOrFailFastMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "The wasm function should have been parsed before generating the dynamic interpreter thunk");

        if (this->m_dynamicInterpreterThunk == nullptr)
        {
            // NOTE: Etw rundown thread may be reading this->dynamicInterpreterThunk concurrently. We don't need to synchronize
            // access as it is ok for etw rundown to get either null or updated new value.

            if (m_isAsmJsFunction)
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicAsmJsInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            else
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            if (this->m_dynamicInterpreterThunk != nullptr)
            {
                JS_ETW(EtwTrace::LogMethodInterpreterThunkLoadEvent(this));
            }
        }
        else
        {
            this->SetOriginalEntryPoint((JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(this->m_dynamicInterpreterThunk));
        }

#if DBG
        if (GetScriptContext()->GetThreadContext()->NoDynamicThunks())
        {
            Assert(this->m_dynamicInterpreterThunk == nullptr);
#ifdef ASMJS_PLAT
            if (m_isAsmJsFunction)
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk);
            }
            else
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
            }
#else
            Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
#endif
        }
#endif
    }